

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_type_info.hpp
# Opt level: O1

shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_true> __thiscall
duckdb::EnumTypeInfoTemplated<unsigned_int>::Deserialize
          (EnumTypeInfoTemplated<unsigned_int> *this,Deserializer *deserializer,uint32_t size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_true> sVar1;
  anon_class_16_2_81344e6c func;
  string_t *strings;
  Vector values_insert_order;
  undefined1 local_b5;
  uint local_b4;
  EnumTypeInfoTemplated<unsigned_int> *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  string_t *local_a0;
  LogicalType local_98;
  Vector local_80;
  
  local_b4 = size;
  LogicalType::LogicalType(&local_98,VARCHAR);
  Vector::Vector(&local_80,&local_98,(ulong)local_b4);
  LogicalType::~LogicalType(&local_98);
  local_a0 = (string_t *)local_80.data;
  func.values_insert_order = &local_80;
  func.strings = &local_a0;
  Deserializer::
  ReadList<duckdb::EnumTypeInfoTemplated<unsigned_int>::Deserialize(duckdb::Deserializer&,unsigned_int)::_lambda(duckdb::Deserializer::List&,unsigned_long)_1_>
            (deserializer,0xc9,"values",func);
  local_b0 = (EnumTypeInfoTemplated<unsigned_int> *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::EnumTypeInfoTemplated<unsigned_int>,std::allocator<duckdb::EnumTypeInfoTemplated<unsigned_int>>,duckdb::Vector&,unsigned_int&>
            (&local_a8,&local_b0,
             (allocator<duckdb::EnumTypeInfoTemplated<unsigned_int>_> *)&local_b5,&local_80,
             &local_b4);
  (this->super_EnumTypeInfo).super_ExtraTypeInfo._vptr_ExtraTypeInfo = (_func_int **)local_b0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_EnumTypeInfo).super_ExtraTypeInfo.type = local_a8._M_pi;
  if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
    }
  }
  if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
  }
  if (local_80.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_80.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_80.type);
  sVar1.internal.
  super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.internal.
  super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_true>)
         sVar1.internal.
         super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static shared_ptr<EnumTypeInfoTemplated> Deserialize(Deserializer &deserializer, uint32_t size) {
		Vector values_insert_order(LogicalType::VARCHAR, size);
		auto strings = FlatVector::GetData<string_t>(values_insert_order);

		deserializer.ReadList(201, "values", [&](Deserializer::List &list, idx_t i) {
			strings[i] = StringVector::AddStringOrBlob(values_insert_order, list.ReadElement<string>());
		});
		return make_shared_ptr<EnumTypeInfoTemplated>(values_insert_order, size);
	}